

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_serialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *name)

{
  pointer pcVar1;
  int iVar2;
  t_type *ttype;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  t_struct *tstruct;
  char *pcVar5;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar6 [12];
  string ename;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar4,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&tfield->name_);
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)&tfield->name_);
    t_generator::decapitalize(&ename,(t_generator *)this,&local_70);
    std::__cxx11::string::operator=((string *)name,(string *)&ename);
    std::__cxx11::string::~string((string *)&ename);
    std::__cxx11::string::~string((string *)&local_70);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 == '\0')) {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar2 == '\0') &&
         (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar2 == '\0')) {
        pcVar1 = (tfield->name_)._M_dataplus._M_p;
        iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
               *(undefined8 *)CONCAT44(extraout_var_00,iVar2));
        goto LAB_002600ea;
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar3,"oprot#");
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar2 != '\0') {
        this_01 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        switch(this_01) {
        case (t_base_type *)0x0:
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",name);
          __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          pcVar5 = "writeString(";
          break;
        case (t_base_type *)0x2:
          pcVar5 = "writeBool(";
          break;
        case (t_base_type *)0x3:
          pcVar5 = "writeByte(";
          break;
        case (t_base_type *)0x4:
          pcVar5 = "writeI16(";
          break;
        case (t_base_type *)0x5:
          pcVar5 = "writeI32(";
          break;
        case (t_base_type *)0x6:
          pcVar5 = "writeI64(";
          break;
        case (t_base_type *)0x7:
          pcVar5 = "writeDouble(";
          break;
        default:
          auVar6 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&ename,this_01,auVar6._8_4_);
          std::operator+(auVar6._0_8_,"compiler error: no ocaml name for base type ",&ename);
          __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        poVar3 = std::operator<<(out,pcVar5);
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::operator<<(poVar3,")");
        goto LAB_002600ea;
      }
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar2 == '\0') goto LAB_002600ea;
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::__cxx11::string::string((string *)&local_50,(string *)CONCAT44(extraout_var,iVar2));
      t_generator::capitalize(&ename,(t_generator *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar3 = std::operator<<(out,"writeI32(");
      poVar3 = std::operator<<(poVar3,(string *)&ename);
      poVar3 = std::operator<<(poVar3,".to_i ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3,")");
      this_00 = &ename;
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,(string *)name);
      generate_serialize_container(this,out,ttype,&local_b0);
      this_00 = &local_b0;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)name);
    generate_serialize_struct(this,out,tstruct,&local_90);
    this_00 = &local_90;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_002600ea:
  poVar3 = std::operator<<(out,";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_ocaml_generator::generate_serialize_field(ostream& out, t_field* tfield, string name) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + tfield->get_name();
  }

  if (name.length() == 0) {
    name = decapitalize(tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {

    indent(out) << "oprot#";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString(" << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no ocaml name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      string ename = capitalize(type->get_name());
      out << "writeI32(" << ename << ".to_i " << name << ")";
    }

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
  out << ";" << endl;
}